

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O1

void __thiscall
TPZMatrix<std::complex<long_double>_>::Print
          (TPZMatrix<std::complex<long_double>_> *this,char *name,ostream *out,
          MatrixOutputFormat form)

{
  char cVar1;
  int iVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  int iVar7;
  size_t sVar8;
  ostream *poVar9;
  long lVar10;
  ulong uVar11;
  char *pcVar12;
  undefined8 uVar13;
  long lVar14;
  long lVar15;
  longdouble in_ST0;
  longdouble lVar16;
  longdouble in_ST1;
  longdouble in_ST2;
  longdouble in_ST3;
  longdouble in_ST4;
  longdouble in_ST5;
  complex<long_double> val;
  ios cout_state;
  char local_1b9;
  long local_1b8;
  long local_1b0;
  undefined1 local_1a8 [16];
  longdouble local_198;
  undefined4 local_188;
  undefined4 uStack_184;
  undefined2 uStack_180;
  undefined4 local_178;
  undefined4 uStack_174;
  undefined2 uStack_170;
  char *local_160;
  undefined1 local_158 [32];
  ios local_138 [264];
  
  std::ios::ios(local_138,(streambuf *)0x0);
  std::ios::copyfmt((ios *)local_138);
  lVar14 = *(long *)out;
  *(undefined8 *)(out + *(long *)(lVar14 + -0x18) + 8) = 0x15;
  if (EFixedColumn < form) goto LAB_00c45586;
  lVar15 = (this->super_TPZBaseMatrix).fRow;
  local_1b8 = (this->super_TPZBaseMatrix).fCol;
  iVar2 = (int)out;
  cVar1 = (char)out;
  local_1b0 = lVar15;
  switch(form) {
  case EFormatted:
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    lVar14 = local_1b0;
    if (name != (char *)0x0) {
      sVar8 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar9 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," x ",3);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"):\n",3);
    if (0 < lVar14) {
      lVar14 = 0;
      local_198 = (longdouble)CONCAT28(local_198._8_2_,"\n");
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\t",1);
        if (0 < local_1b8) {
          lVar15 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      ((complex *)&local_188,this,lVar14,lVar15);
            poVar9 = std::operator<<(out,(complex *)&local_188);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"  ",2);
            lVar15 = lVar15 + 1;
          } while (local_1b8 != lVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_1b0);
      goto LAB_00c45574;
    }
    lVar14 = 1;
    local_198 = (longdouble)CONCAT28(local_198._8_2_,"\n");
    goto LAB_00c45579;
  case EInputFormat:
    poVar9 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    lVar14 = 9;
    local_198 = (longdouble)CONCAT28(local_198._8_2_,"-1 -1 0.\n");
    if (0 < lVar15) {
      lVar14 = 0;
      do {
        if (0 < local_1b8) {
          lVar15 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      ((complex *)&local_188,this,lVar14,lVar15);
            lVar16 = (longdouble)CONCAT28(uStack_170,CONCAT44(uStack_174,local_178));
            if ((longdouble)CONCAT28(uStack_180,CONCAT44(uStack_184,local_188)) == (longdouble)0) {
              if ((lVar16 != (longdouble)0) || (NAN(lVar16) || NAN((longdouble)0)))
              goto LAB_00c44e9e;
            }
            else {
LAB_00c44e9e:
              poVar9 = std::ostream::_M_insert<long>((long)out);
              local_1b9 = ' ';
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
              poVar9 = std::ostream::_M_insert<long>((long)poVar9);
              local_1b9 = ' ';
              poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
              poVar9 = std::operator<<(poVar9,(complex *)&local_188);
              std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
              std::ostream::put((char)poVar9);
              std::ostream::flush();
            }
            lVar15 = lVar15 + 1;
          } while (local_1b8 != lVar15);
        }
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_1b0);
      lVar14 = 9;
    }
    goto LAB_00c45579;
  case EMathematicaInput:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar14 + -0x18));
    }
    else {
      sVar8 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar8);
    }
    lVar14 = local_1b0;
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
    if (0 < lVar14) {
      local_198 = (longdouble)CONCAT28(local_198._8_2_,local_1b8 + -1);
      local_160 = (char *)(lVar14 + -1);
      local_1a8._0_10_ = (unkuint10)(ushort)local_1a8._8_2_ << 0x40;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n{ ",3);
        if (0 < local_1b8) {
          uVar11 = 1;
          lVar14 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_188,this,local_1a8._0_8_,lVar14);
            poVar9 = std::ostream::_M_insert<long_double>
                               ((longdouble)CONCAT28(uStack_180,CONCAT44(uStack_184,local_188)));
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"+I",2);
            std::ostream::_M_insert<long_double>
                      ((longdouble)CONCAT28(uStack_170,CONCAT44(uStack_174,local_178)));
            if (lVar14 < (long)local_198._0_8_) {
              std::__ostream_insert<char,std::char_traits<char>>(out,", ",2);
            }
            if ((uVar11 / 6) * 6 + -1 == lVar14) {
              local_1b9 = '\n';
              std::__ostream_insert<char,std::char_traits<char>>(out,&local_1b9,1);
            }
            lVar14 = lVar14 + 1;
            uVar11 = uVar11 + 1;
          } while (local_1b8 != lVar14);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out," }",2);
        if ((long)local_1a8._0_8_ < (long)local_160) {
          std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
        }
        lVar14 = local_1a8._0_8_ + 1;
        local_1a8._0_8_ = lVar14;
      } while (lVar14 != local_1b0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out," };",3);
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    break;
  case EMatlabNonZeros:
    if (name == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(lVar14 + -0x18));
    }
    else {
      sVar8 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar8);
    }
    local_198 = (longdouble)CONCAT28(local_198._8_2_,"\n");
    if (0 < local_1b0) {
      lVar14 = 0;
      local_1a8._0_10_ = (unkbyte10)1e-16;
      do {
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n|",2);
        if (0 < local_1b8) {
          lVar15 = 0;
          lVar16 = in_ST0;
          lVar3 = in_ST1;
          lVar4 = in_ST2;
          lVar5 = in_ST3;
          lVar6 = in_ST4;
          do {
            in_ST4 = in_ST5;
            in_ST3 = lVar6;
            in_ST2 = lVar5;
            in_ST1 = lVar4;
            in_ST0 = lVar3;
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (local_158,this,lVar14,lVar15);
            local_188 = (undefined4)local_158._0_10_;
            uStack_184 = SUB104(local_158._0_10_,4);
            uStack_180 = SUB102(local_158._0_10_,8);
            local_178 = (undefined4)local_158._16_10_;
            uStack_174 = SUB104(local_158._16_10_,4);
            uStack_170 = SUB102(local_158._16_10_,8);
            in_ST5 = in_ST4;
            cabsl();
            pcVar12 = ".";
            if ((longdouble)local_1a8._0_10_ <= ABS(lVar16)) {
              pcVar12 = "#";
            }
            std::__ostream_insert<char,std::char_traits<char>>(out,pcVar12,1);
            lVar15 = lVar15 + 1;
            lVar16 = in_ST0;
            lVar3 = in_ST1;
            lVar4 = in_ST2;
            lVar5 = in_ST3;
            lVar6 = in_ST4;
          } while (local_1b8 != lVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"|",1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_1b0);
    }
LAB_00c45574:
    lVar14 = 1;
LAB_00c45579:
    std::__ostream_insert<char,std::char_traits<char>>(out,local_198._0_8_,lVar14);
    break;
  case EMatrixMarket:
    iVar7 = (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x10])(this);
    local_1a8._0_4_ = iVar7;
    local_160 = name;
    if (0 < local_1b0) {
      lVar14 = 0;
      do {
        local_198 = (longdouble)CONCAT28(local_198._8_2_,lVar14 + 1);
        lVar15 = lVar14 + 1;
        if (local_1a8._0_4_ == 0) {
          lVar15 = local_1b0;
        }
        if (lVar15 < 2) {
          lVar15 = 1;
        }
        lVar10 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_188,this,lVar14,lVar10);
          lVar10 = lVar10 + 1;
        } while (lVar15 != lVar10);
        lVar14 = (long)local_198._0_8_;
      } while (local_198._0_8_ != (char *)local_1b0);
    }
    lVar14 = local_1b0;
    std::__ostream_insert<char,std::char_traits<char>>(out,"%%",2);
    pcVar12 = local_160;
    if (local_160 == (char *)0x0) {
      std::ios::clear(iVar2 + (int)*(undefined8 *)(*(long *)out + -0x18));
    }
    else {
      sVar8 = strlen(local_160);
      std::__ostream_insert<char,std::char_traits<char>>(out,pcVar12,sVar8);
    }
    std::ios::widen((char)*(undefined8 *)(*(long *)out + -0x18) + cVar1);
    std::ostream::put(cVar1);
    std::ostream::flush();
    poVar9 = std::ostream::_M_insert<long>((long)out);
    local_188._0_1_ = (complex)0x20;
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_188,1);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    local_188 = CONCAT31(local_188._1_3_,0x20);
    poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,(char *)&local_188,1);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar9 + -0x18) + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
    if (0 < lVar14) {
      lVar15 = 0;
      do {
        local_1b8 = lVar15 + 1;
        lVar10 = local_1b8;
        if (local_1a8._0_4_ == 0) {
          lVar10 = lVar14;
        }
        if (lVar10 < 2) {
          lVar10 = 1;
        }
        lVar14 = 0;
        do {
          (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                    (&local_188,this,lVar15,lVar14);
          lVar16 = (longdouble)CONCAT28(uStack_170,CONCAT44(uStack_174,local_178));
          if ((longdouble)CONCAT28(uStack_180,CONCAT44(uStack_184,local_188)) == (longdouble)0) {
            if ((lVar16 != (longdouble)0) || (NAN(lVar16) || NAN((longdouble)0))) goto LAB_00c4572e;
          }
          else {
LAB_00c4572e:
            poVar9 = std::ostream::_M_insert<long>((long)out);
            local_1b9 = ' ';
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
            poVar9 = std::ostream::_M_insert<long>((long)poVar9);
            local_1b9 = ' ';
            poVar9 = std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
            poVar9 = std::operator<<(poVar9,(complex *)&local_188);
            local_1b9 = '\n';
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
          }
          lVar14 = lVar14 + 1;
        } while (lVar10 != lVar14);
        lVar14 = local_1b0;
        lVar15 = local_1b8;
      } while (local_1b8 != local_1b0);
    }
    break;
  case ECSV:
    if (0 < lVar15) {
      lVar14 = local_1b8 + -1;
      local_198 = (longdouble)CONCAT28(local_198._8_2_,lVar15 + -1);
      lVar15 = 0;
      do {
        if (0 < local_1b8) {
          lVar10 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x24])
                      (&local_188,this,lVar15,lVar10);
            local_1a8._0_10_ = CONCAT28(uStack_170,CONCAT44(uStack_174,local_178));
            poVar9 = std::ostream::_M_insert<long_double>
                               ((longdouble)CONCAT28(uStack_180,CONCAT44(uStack_184,local_188)));
            local_1b9 = ((longdouble)local_1a8._0_10_ <= (longdouble)0) * '\x02' + '+';
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,&local_1b9,1);
            poVar9 = std::ostream::_M_insert<long_double>
                               (ABS((longdouble)CONCAT28(uStack_170,CONCAT44(uStack_174,local_178)))
                               );
            std::__ostream_insert<char,std::char_traits<char>>(poVar9,"j",1);
            if (lVar10 < lVar14) {
              std::__ostream_insert<char,std::char_traits<char>>(out," , ",3);
            }
            lVar10 = lVar10 + 1;
          } while (local_1b8 != lVar10);
        }
        if (lVar15 < (long)local_198._0_8_) {
          std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != local_1b0);
    }
    break;
  case EFixedColumn:
    std::__ostream_insert<char,std::char_traits<char>>(out,"Writing matrix \'",0x10);
    lVar14 = local_1b0;
    if (name != (char *)0x0) {
      sVar8 = strlen(name);
      std::__ostream_insert<char,std::char_traits<char>>(out,name,sVar8);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\' (",3);
    poVar9 = std::ostream::_M_insert<long>((long)out);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9," x ",3);
    poVar9 = std::ostream::_M_insert<long>((long)poVar9);
    std::__ostream_insert<char,std::char_traits<char>>(poVar9,"):\n",3);
    if (0 < lVar14) {
      lVar14 = 0;
      do {
        if (0 < local_1b8) {
          lVar15 = 0;
          do {
            (*(this->super_TPZBaseMatrix).super_TPZSavable._vptr_TPZSavable[0x21])
                      (&local_188,this,lVar14,lVar15);
            local_198 = (longdouble)CONCAT28(uStack_180,CONCAT44(uStack_184,local_188));
            local_1a8._0_10_ = CONCAT28(uStack_170,CONCAT44(uStack_174,local_178));
            std::__ostream_insert<char,std::char_traits<char>>(out,"(",1);
            uVar13 = 0x16;
            if ((longdouble)0 <= local_198) {
              uVar13 = 0x15;
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            }
            lVar10 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar10 + -0x18) + 0x10) = uVar13;
            lVar10 = *(long *)(lVar10 + -0x18);
            *(uint *)(out + lVar10 + 0x18) = *(uint *)(out + lVar10 + 0x18) & 0xffffff4f | 0x20;
            poVar9 = std::ostream::_M_insert<long_double>(local_198);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(out,",",1);
            uVar13 = 0x16;
            if ((longdouble)0 <= (longdouble)local_1a8._0_10_) {
              uVar13 = 0x15;
              std::__ostream_insert<char,std::char_traits<char>>(out," ",1);
            }
            lVar10 = *(long *)out;
            *(undefined8 *)(out + *(long *)(lVar10 + -0x18) + 0x10) = uVar13;
            lVar10 = *(long *)(lVar10 + -0x18);
            *(uint *)(out + lVar10 + 0x18) = *(uint *)(out + lVar10 + 0x18) & 0xffffff4f | 0x20;
            poVar9 = std::ostream::_M_insert<long_double>((longdouble)local_1a8._0_10_);
            std::__ostream_insert<char,std::char_traits<char>>(poVar9," ",1);
            std::__ostream_insert<char,std::char_traits<char>>(out,")",1);
            lVar15 = lVar15 + 1;
          } while (local_1b8 != lVar15);
        }
        std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
        lVar14 = lVar14 + 1;
      } while (lVar14 != local_1b0);
    }
    std::__ostream_insert<char,std::char_traits<char>>(out,"\n",1);
  }
LAB_00c45586:
  std::ios::copyfmt((ios *)(out + *(long *)(*(long *)out + -0x18)));
  std::ios_base::~ios_base((ios_base *)local_138);
  return;
}

Assistant:

void TPZMatrix<TVar>::Print(const char *name, std::ostream& out,const MatrixOutputFormat form) const {
    if constexpr (std::is_same<TVar, TFad<6, REAL>>::value ||
                  std::is_same<TVar, Fad<float>>::value ||
                  std::is_same<TVar, Fad<double>>::value ||
                  std::is_same<TVar, Fad<long double>>::value) {
        out << name << std::endl;
        for (int64_t i = 0; i < fRow; i++) {
            for (int64_t j = 0; j < fCol; j++) {
                out << "i = " << i << " j = " << j << " val " << Get(i, j) << std::endl;
            }
        }
        return;
   
    }
    //getting current settings of std::ostream instance
    std::ios cout_state(nullptr);
    cout_state.copyfmt(out);

    typedef std::numeric_limits< RTVar > typlim;
    out << std::setprecision(typlim::max_digits10);

    const auto nrows = Rows();
    const auto ncols = Cols();
    
    if(form == EFormatted) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
		
        for ( int64_t row = 0; row < nrows; row++) {
            out << "\t";
            for ( int64_t col = 0; col < ncols; col++ ) {
                out << GetVal( row, col) << "  ";//complex numbers are (a,b)
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EFixedColumn) {
        out << "Writing matrix '";
        if(name) out << name;
        out << "' (" << nrows << " x " << ncols << "):\n";
        TVar value;
        constexpr int columnlength = typlim::max_digits10;

        auto PrintVal = [columnlength](std::ostream &out, RTVar val){
            if(val<0.) {
                out << std::setw(columnlength+1) << std::left << val << " ";
            }else{
                out << " ";
                out << std::setw(columnlength)   << std::left << val << " ";
            }
        };
        
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                value = Get( row, col);
                if constexpr (std::is_same_v<RTVar,TVar>){
                    PrintVal(out,value);
                }else{
                    out<<"(";
                    PrintVal(out,value.real());
                    out<<",";
                    PrintVal(out,value.imag());
                    out<<")";
                }
            }
            out << "\n";
        }
        out << "\n";
    } else if (form == EInputFormat) {
        out << nrows << " " << ncols << endl;
        for ( int64_t row = 0; row < nrows; row++) {
            for ( int64_t col = 0; col < ncols; col++ ) {
                const TVar val = GetVal(row, col);
                if(val != (TVar)0.) out << row << ' ' << col << ' ' << val << std::endl;
            }
        }
        out << "-1 -1 0.\n";
    } else if( form == EMathematicaInput)
        {
            
            out << name << "\n{ ";
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n{ ";
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        out << val.real() << "+I"<<val.imag();
                    }
                    if(col < ncols-1)
                        out << ", ";
                    if((col+1) % 6 == 0) out << '\n';
                }
                out << " }";
                if(row < nrows-1)
                    out << ",";
            }
		
            out << " };"<<std::endl;
		
        }else if( form == ECSV)
        {
         
            for ( int64_t row = 0; row < nrows; row++) {
                for ( int64_t col = 0; col < ncols; col++ ) {
                    const TVar val = GetVal(row, col);
                    if constexpr (std::is_same_v<TVar,RTVar>){
                        out << val;
                    }else{
                        const auto signchar = val.imag() > 0 ? '+' : '-';
                        out << val.real() <<signchar<<std::fabs(val.imag())<<"j";
                    }
                    if(col < ncols-1)  out << " , ";
                }
                if(row < nrows-1)
                    out << "\n";
            }

        } else if( form == EMatlabNonZeros)
        {
            out << name;
            for ( int64_t row = 0; row < nrows; row++) {
                out << "\n|";
                for ( int64_t col = 0; col < ncols; col++ )
                    if(IsZero(GetVal(row, col)) ){
                        out << ".";
                    }else{
                        out << "#";
                    }
                out << "|";
            }
            out << "\n";
        }
    else if( form == EMatrixMarket)
        {
            bool sym = IsSymmetric();
            int64_t numzero = 0;
            int64_t nrow = nrows;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            numzero++;
                        }
                    }
            }
            out << "%%"<< name << std::endl;
            out << nrows << ' ' << ncols << ' ' << numzero << std::endl;
            for ( int64_t row = 0; row < nrows; row++) {
                int64_t colmax = nrow;
                if (sym) colmax = row+1;
                for (int64_t col = 0; col < colmax; col++ )
                    {
                        const TVar val = GetVal(row, col);
                        if (val != (TVar)0.) {
                            out << row+1 << ' ' << col+1 << ' ' << val << '\n';
                        }
                    }
            }
        }
    //restore precision
    out.copyfmt(cout_state);
}